

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::Reset(CScanner *this)

{
  CScanner *this_local;
  
  CParser::Reset(&this->super_CParser);
  this->line = 1;
  this->position = 1;
  this->afterCarriageReturn = false;
  this->preprocessingState = PS_Initial;
  this->savedPreprocessingState = PS_Initial;
  this->state = S_Initial;
  return;
}

Assistant:

void CScanner::Reset()
{
	CParser::Reset();
	line = FirstLineNumber;
	position = FirstCharacterNumber;
	afterCarriageReturn = false;
	preprocessingState = PS_Initial;
	savedPreprocessingState = PS_Initial;
	state = S_Initial;
}